

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

void __thiscall phosg::SubprocessResult::SubprocessResult(SubprocessResult *this)

{
  uint64_t uVar1;
  SubprocessResult *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  ::std::__cxx11::string::string((string *)&this->stderr_contents);
  uVar1 = now();
  this->elapsed_time = uVar1;
  return;
}

Assistant:

SubprocessResult::SubprocessResult() : elapsed_time(now()) {}